

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

wchar_t map_bind(EditLine *el,wchar_t argc,wchar_t **argv)

{
  el_bindings_t *peVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  wchar_t cmd_00;
  wchar_t *pwVar6;
  keymacro_value_t *pkVar7;
  wchar_t key;
  wchar_t cmd;
  el_bindings_t *ep;
  el_bindings_t *bp;
  wchar_t *out;
  wchar_t *in;
  wchar_t outbuf [1024];
  wchar_t inbuf [1024];
  wchar_t *p;
  wchar_t rem;
  wchar_t ntype;
  el_action_t *map;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if (argv == (wchar_t **)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    _rem = (el->el_map).key;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    argv_local._4_4_ = 1;
    while ((pwVar6 = argv[argv_local._4_4_], pwVar6 != (wchar_t *)0x0 && (*pwVar6 == L'-'))) {
      switch(pwVar6[1]) {
      case L'a':
        _rem = (el->el_map).alt;
        break;
      default:
        fprintf((FILE *)el->el_errfile,"%ls: Invalid switch `%lc\'.\n",*argv,(ulong)(uint)pwVar6[1])
        ;
        break;
      case L'e':
        map_init_emacs(el);
        return L'\0';
      case L'k':
        bVar3 = true;
        break;
      case L'l':
        peVar1 = (el->el_map).help;
        sVar2 = (el->el_map).nfunc;
        for (ep = (el->el_map).help; ep < peVar1 + sVar2; ep = ep + 1) {
          fprintf((FILE *)el->el_outfile,"%ls\n\t%ls\n",ep->name,ep->description);
        }
        return L'\0';
      case L'r':
        bVar4 = true;
        break;
      case L's':
        bVar5 = true;
        break;
      case L'v':
        map_init_vi(el);
        return L'\0';
      }
      argv_local._4_4_ = argv_local._4_4_ + 1;
    }
    if (argv[argv_local._4_4_] == (wchar_t *)0x0) {
      map_print_all_keys(el);
      el_local._4_4_ = L'\0';
    }
    else {
      if (bVar3) {
        out = argv[argv_local._4_4_];
      }
      else {
        out = parse__string(outbuf + 0x3fe,argv[argv_local._4_4_]);
        if (out == (wchar_t *)0x0) {
          fprintf((FILE *)el->el_errfile,"%ls: Invalid \\ or ^ in instring.\n",*argv);
          return L'\xffffffff';
        }
      }
      argv_local._4_4_ = argv_local._4_4_ + 1;
      if (bVar4) {
        if (bVar3) {
          terminal_clear_arrow(el,out);
          el_local._4_4_ = L'\xffffffff';
        }
        else {
          if (out[1] == L'\0') {
            if (_rem[(uint)(*out & 0xff)] == '\x19') {
              keymacro_delete(el,out);
            }
            else {
              _rem[(uint)(*out & 0xff)] = '\x1c';
            }
          }
          else {
            keymacro_delete(el,out);
          }
          el_local._4_4_ = L'\0';
        }
      }
      else if (argv[argv_local._4_4_] == (wchar_t *)0x0) {
        if (bVar3) {
          terminal_print_arrow(el,out);
        }
        else {
          map_print_key(el,_rem,out);
        }
        el_local._4_4_ = L'\0';
      }
      else {
        if (bVar5) {
          if (!bVar5) {
            abort();
          }
          pwVar6 = parse__string((wchar_t *)&in,argv[argv_local._4_4_]);
          if (pwVar6 == (wchar_t *)0x0) {
            fprintf((FILE *)el->el_errfile,"%ls: Invalid \\ or ^ in outstring.\n",*argv);
            return L'\xffffffff';
          }
          if (bVar3) {
            pkVar7 = keymacro_map_str(el,pwVar6);
            terminal_set_arrow(el,out,pkVar7,L'\x01');
          }
          else {
            pkVar7 = keymacro_map_str(el,pwVar6);
            keymacro_add(el,out,pkVar7,L'\x01');
          }
          _rem[(uint)(*out & 0xff)] = '\x19';
        }
        else {
          cmd_00 = parse_cmd(el,argv[argv_local._4_4_]);
          if (cmd_00 == L'\xffffffff') {
            fprintf((FILE *)el->el_errfile,"%ls: Invalid command `%ls\'.\n",*argv,
                    argv[argv_local._4_4_]);
            return L'\xffffffff';
          }
          if (bVar3) {
            pkVar7 = keymacro_map_cmd(el,cmd_00);
            terminal_set_arrow(el,out,pkVar7,L'\0');
          }
          else if (out[1] == L'\0') {
            keymacro_clear(el,_rem,out);
            _rem[(uint)(*out & 0xff)] = (el_action_t)cmd_00;
          }
          else {
            pkVar7 = keymacro_map_cmd(el,cmd_00);
            keymacro_add(el,out,pkVar7,L'\0');
            _rem[(uint)(*out & 0xff)] = '\x19';
          }
        }
        el_local._4_4_ = L'\0';
      }
    }
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
map_bind(EditLine *el, int argc, const wchar_t **argv)
{
	el_action_t *map;
	int ntype, rem;
	const wchar_t *p;
	wchar_t inbuf[EL_BUFSIZ];
	wchar_t outbuf[EL_BUFSIZ];
	const wchar_t *in = NULL;
	wchar_t *out;
	el_bindings_t *bp, *ep;
	int cmd;
	int key;

	if (argv == NULL)
		return -1;

	map = el->el_map.key;
	ntype = XK_CMD;
	key = rem = 0;
	for (argc = 1; (p = argv[argc]) != NULL; argc++)
		if (p[0] == '-')
			switch (p[1]) {
			case 'a':
				map = el->el_map.alt;
				break;

			case 's':
				ntype = XK_STR;
				break;
			case 'k':
				key = 1;
				break;

			case 'r':
				rem = 1;
				break;

			case 'v':
				map_init_vi(el);
				return 0;

			case 'e':
				map_init_emacs(el);
				return 0;

			case 'l':
				ep = &el->el_map.help[el->el_map.nfunc];
				for (bp = el->el_map.help; bp < ep; bp++)
					(void) fprintf(el->el_outfile,
					    "%ls\n\t%ls\n",
					    bp->name, bp->description);
				return 0;
			default:
				(void) fprintf(el->el_errfile,
				    "%ls: Invalid switch `%lc'.\n",
				    argv[0], (wint_t)p[1]);
			}
		else
			break;

	if (argv[argc] == NULL) {
		map_print_all_keys(el);
		return 0;
	}
	if (key)
		in = argv[argc++];
	else if ((in = parse__string(inbuf, argv[argc++])) == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Invalid \\ or ^ in instring.\n",
		    argv[0]);
		return -1;
	}
	if (rem) {
		if (key) {
			(void) terminal_clear_arrow(el, in);
			return -1;
		}
		if (in[1])
			(void) keymacro_delete(el, in);
		else if (map[(unsigned char) *in] == ED_SEQUENCE_LEAD_IN)
			(void) keymacro_delete(el, in);
		else
			map[(unsigned char) *in] = ED_UNASSIGNED;
		return 0;
	}
	if (argv[argc] == NULL) {
		if (key)
			terminal_print_arrow(el, in);
		else
			map_print_key(el, map, in);
		return 0;
	}
#ifdef notyet
	if (argv[argc + 1] != NULL) {
		bindkeymacro_usage();
		return -1;
	}
#endif

	switch (ntype) {
	case XK_STR:
		if ((out = parse__string(outbuf, argv[argc])) == NULL) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid \\ or ^ in outstring.\n", argv[0]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_str(el, out), ntype);
		else
			keymacro_add(el, in, keymacro_map_str(el, out), ntype);
		map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
		break;

	case XK_CMD:
		if ((cmd = parse_cmd(el, argv[argc])) == -1) {
			(void) fprintf(el->el_errfile,
			    "%ls: Invalid command `%ls'.\n",
			    argv[0], argv[argc]);
			return -1;
		}
		if (key)
			terminal_set_arrow(el, in, keymacro_map_cmd(el, cmd), ntype);
		else {
			if (in[1]) {
				keymacro_add(el, in, keymacro_map_cmd(el, cmd), ntype);
				map[(unsigned char) *in] = ED_SEQUENCE_LEAD_IN;
			} else {
				keymacro_clear(el, map, in);
				map[(unsigned char) *in] = (el_action_t)cmd;
			}
		}
		break;

	/* coverity[dead_error_begin] */
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
		break;
	}
	return 0;
}